

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

Privkey * cfd::core::ConfidentialTransaction::GetIssuanceBlindingKey
                    (Privkey *__return_storage_ptr__,Privkey *master_blinding_key,Txid *txid,
                    uint32_t vout)

{
  ScriptBuilder builder;
  ByteData256 data;
  Script script;
  int64_t vout64;
  ScriptBuilder local_e8;
  ByteData local_c8;
  ByteData local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  ByteData256 local_80;
  Script local_68;
  ulong local_30;
  
  local_e8._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00259a18;
  local_e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScriptBuilder::AppendOperator(&local_e8,(ScriptOperator *)ScriptOperator::OP_RETURN);
  Txid::GetData((ByteData *)&local_68,txid);
  ScriptBuilder::AppendData(&local_e8,(ByteData *)&local_68);
  if (local_68._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_68._vptr_Script);
  }
  local_30 = (ulong)vout;
  ScriptBuilder::AppendData(&local_e8,(int64_t *)&local_30);
  ScriptBuilder::Build(&local_68,&local_e8);
  Privkey::GetData(&local_b0,master_blinding_key);
  ByteData::GetBytes(&local_98,&local_b0);
  Script::GetData(&local_c8,&local_68);
  CryptoUtil::HmacSha256(&local_80,&local_98,&local_c8);
  if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Privkey::Privkey(__return_storage_ptr__,&local_80,kMainnet,true);
  if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Script::~Script(&local_68);
  local_e8._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00259a18;
  if (local_e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey ConfidentialTransaction::GetIssuanceBlindingKey(
    const Privkey &master_blinding_key, const Txid &txid, uint32_t vout) {
  // script: OP_RETURN <txid> <vout>
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_RETURN);
  builder.AppendData(txid.GetData());
  int64_t vout64 = vout;
  builder.AppendData(vout64);
  Script script = builder.Build();

  ByteData256 data = CryptoUtil::HmacSha256(
      master_blinding_key.GetData().GetBytes(), script.GetData());
  return Privkey(data);
}